

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsPort.cpp
# Opt level: O2

long __thiscall AmsPort::DelNotification(AmsPort *this,AmsAddr ams,uint32_t hNotify)

{
  iterator __position;
  long lVar1;
  key_type local_38;
  
  std::mutex::lock(&this->mutex);
  local_38.first = ams;
  local_38.second = hNotify;
  __position = std::
               _Rb_tree<std::pair<const_AmsAddr,_const_unsigned_int>,_std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>,_std::_Select1st<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>,_std::less<std::pair<const_AmsAddr,_const_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<const_AmsAddr,_const_unsigned_int>,_std::shared_ptr<NotificationDispatcher>_>_>_>
               ::find(&(this->dispatcherList)._M_t,&local_38);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->dispatcherList)._M_t._M_impl.super__Rb_tree_header) {
    lVar1 = 0x752;
  }
  else {
    lVar1 = NotificationDispatcher::Erase
                      ((NotificationDispatcher *)__position._M_node[1]._M_left,hNotify,this->tmms);
    std::
    _Rb_tree<std::pair<AmsAddr_const,unsigned_int_const>,std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<AmsAddr_const,unsigned_int_const>,std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>,std::_Select1st<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>,std::less<std::pair<AmsAddr_const,unsigned_int_const>>,std::allocator<std::pair<std::pair<AmsAddr_const,unsigned_int_const>const,std::shared_ptr<NotificationDispatcher>>>>
                        *)&this->dispatcherList,__position);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return lVar1;
}

Assistant:

long AmsPort::DelNotification(const AmsAddr ams, uint32_t hNotify)
{
    std::lock_guard<std::mutex> lock(mutex);
    auto it = dispatcherList.find({ams, hNotify});
    if (it != dispatcherList.end()) {
        const auto status = it->second->Erase(hNotify, tmms);
        dispatcherList.erase(it);
        return status;
    }
    return ADSERR_CLIENT_REMOVEHASH;
}